

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_controller.cpp
# Opt level: O3

void __thiscall
ConfidentialTransactionController_AddPegoutTxOut2_Test::TestBody
          (ConfidentialTransactionController_AddPegoutTxOut2_Test *this)

{
  pointer *ppuVar1;
  bool bVar2;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  AssertionResult gtest_ar;
  undefined1 local_760 [24];
  AssertHelper local_748;
  undefined1 local_740;
  undefined1 local_738 [24];
  undefined1 *local_720 [2];
  undefined1 local_710 [16];
  BlockHash local_700;
  undefined1 *local_6e0;
  undefined1 local_6d8;
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [16];
  pointer local_6b0;
  undefined1 *local_698 [2];
  undefined1 local_688 [16];
  void *local_678 [3];
  undefined1 local_660 [16];
  _func_int *local_650;
  undefined1 local_640 [16];
  void *local_630;
  void *local_618;
  void *local_600;
  code *local_5e8 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_570;
  Script local_558;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_518;
  ConfidentialTransactionController txc;
  Privkey local_498;
  ConfidentialTxOutReference local_478;
  ConfidentialTxOutReference local_380;
  ConfidentialTxOutReference local_288;
  ConfidentialTxInReference local_190;
  
  cfd::ConfidentialTransactionController::ConfidentialTransactionController(&txc,2,0);
  gtest_ar._0_8_ = local_760;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gtest_ar,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",
             "");
  cfd::core::Txid::Txid((Txid *)local_660,(string *)&gtest_ar);
  cfd::ConfidentialTransactionController::AddTxIn((Txid *)&local_190,(uint)&txc,(uint)local_660);
  cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(&local_190);
  local_660._0_8_ = &PTR__Txid_002dbe60;
  if ((pointer)local_660._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_660._8_8_);
  }
  if ((undefined1 *)gtest_ar._0_8_ != local_760) {
    operator_delete((void *)gtest_ar._0_8_);
  }
  local_748.data_ = (AssertHelperData *)local_738;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_748,"XBMr6srTXmWuHifFd8gs54xYfiCBsvrksA","");
  cfd::core::GetElementsAddressFormatList();
  cfd::core::Address::Address((Address *)local_660,(string *)&local_748,(vector *)local_720);
  local_6e0 = (undefined1 *)cfd::core::Amount::CreateBySatoshiAmount(0xbefe33cc397c);
  ppuVar1 = (pointer *)
            ((long)&local_700.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data + 8);
  local_700._vptr_BlockHash = (_func_int **)ppuVar1;
  local_6d8 = extraout_DL;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_700,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"
             ,"");
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)&gtest_ar,(string *)&local_700);
  cfd::ConfidentialTransactionController::AddTxOut
            ((Address *)&local_288,(Amount *)&txc,(ConfidentialAssetId *)local_660);
  cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&local_288);
  gtest_ar._0_8_ = &PTR__ConfidentialAssetId_002dc170;
  if (gtest_ar.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(gtest_ar.message_.ptr_);
  }
  if (local_700._vptr_BlockHash != (_func_int **)ppuVar1) {
    operator_delete(local_700._vptr_BlockHash);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_518);
  cfd::core::Script::~Script(&local_558);
  local_5e8[0] = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_570);
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_5e8);
  if (local_600 != (void *)0x0) {
    operator_delete(local_600);
  }
  if (local_618 != (void *)0x0) {
    operator_delete(local_618);
  }
  if (local_630 != (void *)0x0) {
    operator_delete(local_630);
  }
  if (local_650 != (_func_int *)local_640) {
    operator_delete(local_650);
  }
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             local_720);
  if (local_748.data_ != (AssertHelperData *)local_738) {
    operator_delete(local_748.data_);
  }
  local_6c0._0_8_ = cfd::core::Amount::CreateBySatoshiAmount(1000000000);
  local_748.data_ = (AssertHelperData *)local_738;
  local_6c0[8] = extraout_DL_00;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_748,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"
             ,"");
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)&gtest_ar,(string *)&local_748);
  local_720[0] = local_710;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_720,"0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206",
             "");
  cfd::core::BlockHash::BlockHash(&local_700,(string *)local_720);
  local_6e0 = local_6d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_6e0,"2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo","");
  cfd::core::Address::Address((Address *)local_660,(string *)&local_6e0);
  cfd::core::Pubkey::Pubkey((Pubkey *)local_678);
  cfd::core::Privkey::Privkey(&local_498);
  local_738._16_8_ = "";
  local_698[0] = local_688;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"");
  cfd::core::ByteData::ByteData((ByteData *)&local_6b0);
  cfd::ConfidentialTransactionController::AddPegoutTxOut
            ((Amount *)&local_380,(ConfidentialAssetId *)&txc,(BlockHash *)local_6c0,
             (Address *)&gtest_ar,(NetType)&local_700,(Pubkey *)local_660,(Privkey *)0x0,
             (string *)local_678,(uint)&local_498,(ByteData *)local_698,kMainnet,
             (Address *)&local_6b0);
  cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&local_380);
  if (local_6b0 != (pointer)0x0) {
    operator_delete(local_6b0);
  }
  if (local_698[0] != local_688) {
    operator_delete(local_698[0]);
  }
  if (local_498.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_498.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_678[0] != (void *)0x0) {
    operator_delete(local_678[0]);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_518);
  cfd::core::Script::~Script(&local_558);
  local_5e8[0] = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_570);
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_5e8);
  if (local_600 != (void *)0x0) {
    operator_delete(local_600);
  }
  if (local_618 != (void *)0x0) {
    operator_delete(local_618);
  }
  if (local_630 != (void *)0x0) {
    operator_delete(local_630);
  }
  if (local_650 != (_func_int *)local_640) {
    operator_delete(local_650);
  }
  if (local_6e0 != local_6d0) {
    operator_delete(local_6e0);
  }
  local_700._vptr_BlockHash = (_func_int **)&PTR__BlockHash_002dc1a0;
  if (local_700.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_700.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_720[0] != local_710) {
    operator_delete(local_720[0]);
  }
  gtest_ar._0_8_ = &PTR__ConfidentialAssetId_002dc170;
  if (gtest_ar.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(gtest_ar.message_.ptr_);
  }
  if (local_748.data_ != (AssertHelperData *)local_738) {
    operator_delete(local_748.data_);
  }
  local_748.data_ = (AssertHelperData *)cfd::core::Amount::CreateBySatoshiAmount(0x1c84);
  gtest_ar._0_8_ = local_760;
  local_740 = extraout_DL_01;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gtest_ar,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",
             "");
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)local_660,(string *)&gtest_ar);
  cfd::ConfidentialTransactionController::AddTxOutFee
            ((Amount *)&local_478,(ConfidentialAssetId *)&txc);
  cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&local_478);
  local_660._0_8_ = &PTR__ConfidentialAssetId_002dc170;
  if ((pointer)local_660._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_660._8_8_);
  }
  if ((undefined1 *)gtest_ar._0_8_ != local_760) {
    operator_delete((void *)gtest_ar._0_8_);
  }
  cfd::AbstractTransactionController::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"txc.GetHex().c_str()",
             "\"020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00003a6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000\""
             ,(char *)local_660._0_8_,
             "020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00003a6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000"
            );
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_660._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_650) {
    operator_delete((void *)local_660._0_8_);
  }
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_660);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      local_738._16_8_ = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_748,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0xf8,(char *)local_738._16_8_);
    testing::internal::AssertHelper::operator=(&local_748,(Message *)local_660);
    testing::internal::AssertHelper::~AssertHelper(&local_748);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_660._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_660._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_660._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  txc._0_8_ = &PTR__ConfidentialTransactionController_002dbde8;
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&txc.transaction_);
  return;
}

Assistant:

TEST(ConfidentialTransactionController, AddPegoutTxOut2)
{
    ConfidentialTransactionController txc(2, 0);
    txc.AddTxIn(Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"), 0, 4294967293);
    txc.AddTxOut(
        Address("XBMr6srTXmWuHifFd8gs54xYfiCBsvrksA", cfd::core::GetElementsAddressFormatList()),
        Amount::CreateBySatoshiAmount(209998999992700),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));
    txc.AddPegoutTxOut(
        Amount::CreateBySatoshiAmount(1000000000),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"),
        BlockHash("0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"),
        Address("2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo"));
    txc.AddTxOutFee(
        Amount::CreateBySatoshiAmount(7300),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));

    EXPECT_STREQ(txc.GetHex().c_str(), "020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00003a6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000");

}